

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::CommandMigrate
          (Error *__return_storage_ptr__,CommissionerSafe *this,string *aDstAddr,
          string *aDesignatedNetwork)

{
  promise<ot::commissioner::Error> local_88;
  function<void_(ot::commissioner::Error)> local_68;
  anon_class_8_1_ba1d6e0d local_48;
  anon_class_8_1_ba1d6e0d wait;
  promise<ot::commissioner::Error> pro;
  string *aDesignatedNetwork_local;
  string *aDstAddr_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise((promise<ot::commissioner::Error> *)&wait);
  local_48.pro = (promise<ot::commissioner::Error> *)&wait;
  std::function<void(ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::CommandMigrate(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0&,void>
            ((function<void(ot::commissioner::Error)> *)&local_68,&local_48);
  (*(this->super_Commissioner)._vptr_Commissioner[0x29])(this,&local_68,aDstAddr,aDesignatedNetwork)
  ;
  std::function<void_(ot::commissioner::Error)>::~function(&local_68);
  std::promise<ot::commissioner::Error>::get_future(&local_88);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_88);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_88);
  std::promise<ot::commissioner::Error>::~promise((promise<ot::commissioner::Error> *)&wait);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::CommandMigrate(const std::string &aDstAddr, const std::string &aDesignatedNetwork)
{
    std::promise<Error> pro;
    auto                wait = [&pro](Error aError) { pro.set_value(aError); };

    CommandMigrate(wait, aDstAddr, aDesignatedNetwork);
    return pro.get_future().get();
}